

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  Value *pVVar1;
  StkId pTVar2;
  StkId pTVar3;
  StkId pTVar4;
  Value VVar5;
  int iVar6;
  undefined4 uVar7;
  
  pTVar2 = L->stack;
  pTVar3 = L->top;
  iVar6 = f->tt_;
  uVar7 = *(undefined4 *)&f->field_0xc;
  pTVar3->value_ = f->value_;
  pTVar3->tt_ = iVar6;
  *(undefined4 *)&pTVar3->field_0xc = uVar7;
  iVar6 = p1->tt_;
  uVar7 = *(undefined4 *)&p1->field_0xc;
  pTVar3[1].value_ = p1->value_;
  pTVar3[1].tt_ = iVar6;
  *(undefined4 *)&pTVar3[1].field_0xc = uVar7;
  iVar6 = p2->tt_;
  uVar7 = *(undefined4 *)&p2->field_0xc;
  pTVar3[2].value_ = p2->value_;
  pTVar3[2].tt_ = iVar6;
  *(undefined4 *)&pTVar3[2].field_0xc = uVar7;
  pTVar4 = L->top;
  L->top = pTVar4 + 3;
  if (hasres == 0) {
    L->top = pTVar4 + 4;
    iVar6 = p3->tt_;
    uVar7 = *(undefined4 *)&p3->field_0xc;
    pTVar4[3].value_ = p3->value_;
    pTVar4[3].tt_ = iVar6;
    *(undefined4 *)&pTVar4[3].field_0xc = uVar7;
  }
  if ((L->ci->callstatus & 2) == 0) {
    luaD_callnoyield(L,pTVar3,hasres);
  }
  else {
    luaD_call(L,pTVar3,hasres);
  }
  if (hasres != 0) {
    pTVar3 = L->top;
    L->top = pTVar3 + -1;
    VVar5 = *(Value *)&pTVar3[-1].tt_;
    pVVar1 = (Value *)((long)L->stack + ((long)p3 - (long)pTVar2));
    *pVVar1 = pTVar3[-1].value_;
    pVVar1[1] = VVar5;
  }
  return;
}

Assistant:

void luaT_callTM(lua_State *L, const TValue *f, const TValue *p1,
                 const TValue *p2, TValue *p3, int hasres) {
    ptrdiff_t result = savestack(L, p3);
    StkId func = L->top;
    setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
    setobj2s(L, func + 1, p1);  /* 1st argument */
    setobj2s(L, func + 2, p2);  /* 2nd argument */
    L->top += 3;
    if (!hasres)  /* no result? 'p3' is third argument */
            setobj2s (L, L->top++, p3);  /* 3rd argument */
    /* metamethod may yield only when called from Lua code */
    if (isLua(L->ci))
        luaD_call(L, func, hasres);
    else
        luaD_callnoyield(L, func, hasres);
    if (hasres) {  /* if has result, move it to its place */
        p3 = restorestack(L, result);
        setobjs2s(L, p3, --L->top);
    }
}